

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  cmCompiledGeneratorExpression *pcVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  _Base_ptr __n;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  cmGeneratorTarget *headTarget;
  string *psVar7;
  ostream *poVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  bool hasNewLine;
  string outputFileName;
  string rawCondition;
  string line;
  istringstream iss;
  cmGeneratedFileStream fout;
  bool local_481;
  string local_480;
  long *local_460;
  long local_458;
  long local_450 [2];
  string local_440;
  cmCompiledGeneratorExpression *local_420;
  undefined1 local_418 [120];
  ios_base local_3a0 [264];
  undefined1 local_298 [112];
  ios_base local_228 [504];
  
  pcVar1 = (this->Condition)._M_t.
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  local_460 = local_450;
  _Var2._M_p = (pcVar1->Input)._M_dataplus._M_p;
  local_420 = inputExpression;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,_Var2._M_p,_Var2._M_p + (pcVar1->Input)._M_string_length);
  headTarget = cmLocalGenerator::FindGeneratorTargetToUse(lg,&this->Target);
  if (local_458 == 0) {
LAB_00550900:
    GetOutputFileName(&local_480,this,lg,headTarget,config,lang);
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       (local_420,lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,lang);
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&outputFiles->_M_t,&local_480);
    if ((_Rb_tree_header *)iVar9._M_node == &(outputFiles->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lg->Makefile->OutputFiles,&local_480);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Files,&local_480);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](outputFiles,&local_480);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      sVar4 = (this->NewLineCharacter)._M_string_length;
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
      cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_480,false,sVar4 != 0);
      if (((byte)(*(_func_int **)(local_298._0_8_ + -0x18))[(long)(local_298 + 0x20)] & 5) == 0) {
        cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_418,(string *)psVar7,_S_in);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        local_440._M_string_length = 0;
        local_440.field_2._M_local_buf[0] = '\0';
        local_481 = false;
        while (bVar5 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)local_418,&local_440,&local_481,0xffffffffffffffff),
              bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,local_440._M_dataplus._M_p,local_440._M_string_length);
          sVar4 = (this->NewLineCharacter)._M_string_length;
          if (sVar4 == 0) {
            if (local_481 == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n",1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(this->NewLineCharacter)._M_dataplus._M_p,sVar4);
          }
        }
        bVar5 = cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_298);
        if (bVar5 && perm != 0) {
          cmsys::SystemTools::SetPermissions(local_480._M_dataplus._M_p,perm,false);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                   local_440.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_418);
        std::ios_base::~ios_base(local_3a0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_418,"Could not open file for write in copy operation ",&local_480);
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)local_418);
        if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    }
    else {
      __n = iVar9._M_node[2]._M_parent;
      if ((__n != (_Base_ptr)psVar7->_M_string_length) ||
         ((__n != (_Base_ptr)0x0 &&
          (iVar6 = bcmp(*(void **)(iVar9._M_node + 2),(psVar7->_M_dataplus)._M_p,(size_t)__n),
          iVar6 != 0)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,
                   "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                   ,0xb8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,local_480._M_dataplus._M_p,local_480._M_string_length);
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)local_418);
        if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p == &local_480.field_2) goto LAB_00550c4b;
  }
  else {
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       ((this->Condition)._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        lg,config,headTarget,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,lang);
    local_418._0_8_ = local_418 + 0x10;
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_418,pcVar3,pcVar3 + psVar7->_M_string_length);
    iVar6 = std::__cxx11::string::compare(local_418);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare(local_418);
      if (iVar6 == 0) {
        if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
        goto LAB_00550900;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"Evaluation file condition \"",0x1b);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(char *)local_460,local_458);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\" did not evaluate to valid content. Got \"",0x2a);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_418._0_8_,local_418._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_480);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
    }
    local_480.field_2._M_allocated_capacity = local_418._16_8_;
    local_480._M_dataplus._M_p = (pointer)local_418._0_8_;
    if ((undefined1 *)local_418._0_8_ == local_418 + 0x10) goto LAB_00550c4b;
  }
  operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
LAB_00550c4b:
  if (local_460 != local_450) {
    operator_delete(local_460,local_450[0] + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  cmGeneratorTarget* target = lg->FindGeneratorTargetToUse(this->Target);
  if (!rawCondition.empty()) {
    std::string condResult =
      this->Condition->Evaluate(lg, config, target, nullptr, nullptr, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  const std::string outputFileName =
    this->GetOutputFileName(lg, target, config, lang);
  const std::string& outputContent =
    inputExpression->Evaluate(lg, config, target, nullptr, nullptr, lang);

  auto it = outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  bool openWithBinaryFlag = false;
  if (!this->NewLineCharacter.empty()) {
    openWithBinaryFlag = true;
  }
  cmGeneratedFileStream fout;
  fout.Open(outputFileName, false, openWithBinaryFlag);
  if (!fout) {
    lg->IssueMessage(MessageType::FATAL_ERROR,
                     "Could not open file for write in copy operation " +
                       outputFileName);
    return;
  }
  fout.SetCopyIfDifferent(true);
  std::istringstream iss(outputContent);
  std::string line;
  bool hasNewLine = false;
  while (cmSystemTools::GetLineFromStream(iss, line, &hasNewLine)) {
    fout << line;
    if (!this->NewLineCharacter.empty()) {
      fout << this->NewLineCharacter;
    } else if (hasNewLine) {
      // if new line character is not specified, the file will be opened in
      // text mode. So, "\n" will be translated to the correct newline
      // ending based on the platform.
      fout << "\n";
    }
  }
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}